

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

s32 __thiscall
irr::core::array<irr::gui::CGUIEnvironment::SFont>::binary_search
          (array<irr::gui::CGUIEnvironment::SFont> *this,SFont *element,s32 left,s32 right)

{
  pointer pSVar1;
  int iVar2;
  __normal_iterator<const_irr::gui::CGUIEnvironment::SFont_*,_std::vector<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>_>
  _Var3;
  s32 sVar4;
  
  sVar4 = -1;
  if (left <= right) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<irr::gui::CGUIEnvironment::SFont_const*,std::vector<irr::gui::CGUIEnvironment::SFont,std::allocator<irr::gui::CGUIEnvironment::SFont>>>,irr::gui::CGUIEnvironment::SFont,__gnu_cxx::__ops::_Iter_less_val>
                      (pSVar1 + left,pSVar1 + right,element);
    iVar2 = ::std::__cxx11::string::compare((string *)&((_Var3._M_current)->NamedPath).InternalName)
    ;
    if (-1 < iVar2) {
      iVar2 = ::std::__cxx11::string::compare((string *)&(element->NamedPath).InternalName);
      if (-1 < iVar2) {
        sVar4 = (int)((ulong)((long)_Var3._M_current -
                             (long)(this->m_data).
                                   super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      }
    }
  }
  return sVar4;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}